

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readBitsFromReversedStream(size_t *bitpointer,uchar *bitstream,size_t nbits)

{
  byte bVar1;
  ulong in_RDX;
  uchar *in_RSI;
  size_t *in_RDI;
  size_t i;
  uint result;
  undefined8 local_28;
  undefined4 local_1c;
  
  local_1c = 0;
  for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
    bVar1 = readBitFromReversedStream(in_RDI,in_RSI);
    local_1c = (uint)bVar1 | local_1c << 1;
  }
  return local_1c;
}

Assistant:

static unsigned readBitsFromReversedStream(size_t* bitpointer, const unsigned char* bitstream, size_t nbits)
{
  unsigned result = 0;
  size_t i;
  for(i = 0 ; i < nbits; ++i)
  {
    result <<= 1;
    result |= (unsigned)readBitFromReversedStream(bitpointer, bitstream);
  }
  return result;
}